

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MultiFabUtil.cpp
# Opt level: O1

unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> __thiscall
amrex::get_slice_data
          (amrex *this,int dir,Real coord,MultiFab *cc,Geometry *geom,int start_comp,int ncomp,
          bool interpolate)

{
  Real *pRVar1;
  Real RVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  BaseFab<double> *this_00;
  BaseFab<double> *src;
  undefined1 auVar11 [12];
  Real RVar12;
  Real *pRVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  double dVar17;
  Real RVar18;
  BATType BVar19;
  undefined4 uVar20;
  int iVar21;
  FabArrayBase *pFVar22;
  long lVar23;
  int *piVar24;
  int iVar25;
  pair<int,_amrex::Box> *is;
  pointer __args;
  long lVar26;
  double *pdVar27;
  int iVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  ulong uVar43;
  ulong uVar44;
  Vector<amrex::Box,_std::allocator<amrex::Box>_> boxes;
  unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *slice;
  Vector<int,_std::allocator<int>_> slice_to_full_ba_map;
  Vector<int,_std::allocator<int>_> procs;
  vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> isects;
  Box lhs;
  DistributionMapping slice_dmap;
  RealBox real_slice;
  BoxArray ba;
  BoxArray slice_ba;
  ulong local_3b8;
  int local_3a8;
  int local_398;
  int local_390;
  undefined4 uStack_374;
  undefined4 uStack_370;
  undefined4 uStack_36c;
  long local_368;
  double *local_358;
  double local_348;
  double dStack_340;
  undefined1 local_338 [16];
  Box *local_328;
  _Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_> local_320;
  FabArrayBase *local_318;
  long local_310;
  double *local_308;
  long local_300;
  double *local_2f8;
  long local_2f0;
  void *local_2e8;
  iterator iStack_2e0;
  int *local_2d8;
  undefined1 local_2c8 [16];
  int *local_2b8;
  double local_2a8;
  Real RStack_2a0;
  undefined1 local_298 [24];
  ulong local_280;
  ulong local_278;
  ulong local_270;
  undefined1 local_268 [16];
  pointer local_258;
  Box local_248;
  long local_228;
  Real local_220;
  FabArrayBase *local_218;
  long local_210;
  long local_208;
  double *local_200;
  ulong local_1f8;
  long local_1f0;
  DistributionMapping local_1e8;
  double local_1d8 [3];
  Real aRStack_1c0 [3];
  BoxArray local_1a8;
  BoxArray local_140;
  Real local_d8 [4];
  Real local_b8;
  Real RStack_b0;
  undefined8 local_a8;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  undefined4 uStack_98;
  undefined8 uStack_94;
  Real local_88 [3];
  uint local_70;
  uint local_6c;
  uint local_68;
  CoordType local_64;
  MFInfo local_58;
  
  local_d8[0] = (geom->prob_domain).xlo[0];
  local_d8[1] = (geom->prob_domain).xlo[1];
  local_d8[2] = (geom->prob_domain).xlo[2];
  local_d8[3] = (geom->prob_domain).xhi[0];
  local_b8 = (geom->prob_domain).xhi[1];
  RStack_b0 = (geom->prob_domain).xhi[2];
  local_a8 = *(undefined8 *)(geom->domain).smallend.vect;
  uVar14 = *(undefined8 *)(geom->domain).bigend.vect;
  uStack_94 = *(undefined8 *)((geom->domain).bigend.vect + 2);
  uStack_a0 = (undefined4)*(undefined8 *)((geom->domain).smallend.vect + 2);
  uStack_9c = (undefined4)uVar14;
  uStack_98 = (undefined4)((ulong)uVar14 >> 0x20);
  pRVar1 = (geom->super_CoordSys).dx;
  RVar12 = *pRVar1;
  pRVar13 = (geom->super_CoordSys).dx + 1;
  local_88[1] = *pRVar13;
  auVar40 = *(undefined1 (*) [16])pRVar1;
  RVar2 = (geom->super_CoordSys).dx[2];
  auVar39 = *(undefined1 (*) [16])pRVar13;
  local_70 = (uint)(byte)(geom->super_CoordSys).field_0x51;
  local_6c = (uint)(byte)(geom->super_CoordSys).field_0x52;
  local_68 = (uint)(byte)(geom->super_CoordSys).field_0x53;
  local_64 = (geom->super_CoordSys).c_sys;
  local_2e8 = (void *)0x0;
  iStack_2e0._M_current = (int *)0x0;
  local_2d8 = (int *)0x0;
  local_1d8[0] = (geom->prob_domain).xlo[0];
  local_1d8[1] = (geom->prob_domain).xlo[1];
  local_1d8[2] = (geom->prob_domain).xlo[2];
  aRStack_1c0[0] = (geom->prob_domain).xhi[0];
  aRStack_1c0[1] = (geom->prob_domain).xhi[1];
  aRStack_1c0[2] = (geom->prob_domain).xhi[2];
  local_228 = (long)dir;
  local_88[0] = RVar12;
  local_88[2] = RVar2;
  local_1d8[local_228] = coord;
  dVar17 = local_1d8[2];
  dVar37 = local_1d8[1];
  dVar36 = local_1d8[0];
  aRStack_1c0[local_228] = coord;
  RVar18 = aRStack_1c0[0];
  local_2a8 = (geom->prob_domain).xlo[0];
  RStack_2a0 = (geom->prob_domain).xlo[1];
  dVar34 = (geom->prob_domain).xlo[1];
  dVar35 = (geom->prob_domain).xlo[2];
  auVar42._0_8_ = aRStack_1c0[1] - dVar34;
  auVar42._8_8_ = aRStack_1c0[2] - dVar35;
  local_298._0_16_ = divpd(auVar42,auVar39);
  local_320.super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
       (_Head_base<0UL,_amrex::MultiFab_*,_false>)(_Head_base<0UL,_amrex::MultiFab_*,_false>)this;
  local_220 = coord;
  dVar32 = floor(local_298._0_8_);
  dVar33 = floor((double)local_298._8_8_);
  auVar41._0_8_ = dVar36 - local_2a8;
  auVar41._8_8_ = dVar37 - dVar34;
  auVar38._0_8_ = dVar17 - dVar35;
  auVar38._8_8_ = RVar18 - local_2a8;
  auVar39._8_8_ = RVar12;
  auVar39._0_8_ = RVar2;
  auVar39 = divpd(auVar38,auVar39);
  auVar42 = divpd(auVar41,auVar40);
  dVar34 = floor(auVar39._0_8_);
  uStack_374 = auVar39._4_4_;
  uStack_370 = auVar39._8_4_;
  uStack_36c = auVar39._12_4_;
  auVar11._4_8_ = extraout_XMM0_Qb;
  auVar11._0_4_ = uStack_374;
  auVar40._0_8_ = auVar11._0_8_ << 0x20;
  auVar40._8_4_ = uStack_370;
  auVar40._12_4_ = uStack_36c;
  dVar35 = floor(auVar40._8_8_);
  local_348 = auVar42._0_8_;
  dVar36 = floor(local_348);
  dStack_340 = auVar42._8_8_;
  dVar37 = floor(dStack_340);
  local_248.btype.itype = 0;
  uVar44 = *(ulong *)(geom->domain).smallend.vect;
  uVar43 = CONCAT44(-(uint)((int)(uVar44 >> 0x20) < (int)dVar37),-(uint)((int)uVar44 < (int)dVar36))
  ;
  local_248.smallend.vect._0_8_ = ~uVar43 & uVar44 | CONCAT44((int)dVar37,(int)dVar36) & uVar43;
  local_248.smallend.vect[2] = (geom->domain).smallend.vect[2];
  if (local_248.smallend.vect[2] < (int)dVar34) {
    local_248.smallend.vect[2] = (int)dVar34;
  }
  uVar44 = *(ulong *)(geom->domain).bigend.vect;
  uVar43 = CONCAT44(-(uint)((int)dVar32 < (int)(uVar44 >> 0x20)),-(uint)((int)dVar35 < (int)uVar44))
  ;
  uVar44 = ~uVar43 & uVar44 | CONCAT44((int)dVar32,(int)dVar35) & uVar43;
  local_248.bigend.vect[0] = (int)uVar44;
  local_248.bigend.vect[1] = (int)(uVar44 >> 0x20);
  local_248.bigend.vect[2] = (geom->domain).bigend.vect[2];
  if ((int)dVar33 < local_248.bigend.vect[2]) {
    local_248.bigend.vect[2] = (int)dVar33;
  }
  local_318 = (FabArrayBase *)cc;
  BoxArray::BoxArray(&local_1a8,&(cc->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray)
  ;
  local_268 = (undefined1  [16])0x0;
  local_258 = (pointer)0x0;
  BoxArray::intersections
            (&local_1a8,&local_248,
             (vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> *)
             local_268,false,0);
  local_338 = (undefined1  [16])0x0;
  local_328 = (Box *)0x0;
  local_2b8 = (int *)0x0;
  local_2c8 = (undefined1  [16])0x0;
  uVar14 = local_268._8_8_;
  if (local_268._0_8_ != local_268._8_8_) {
    __args = (pointer)local_268._0_8_;
    do {
      local_140.m_bat.m_bat_type =
           *(BATType *)
            (*(long *)&(((local_318->distributionMap).m_ref.
                         super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr)->m_pmap).super_vector<int,_std::allocator<int>_>.
                       super__Vector_base<int,_std::allocator<int>_>._M_impl +
            (long)__args->first * 4);
      if ((int *)local_2c8._8_8_ == local_2b8) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  ((vector<int,_std::allocator<int>_> *)local_2c8,(iterator)local_2c8._8_8_,
                   (int *)&local_140);
      }
      else {
        *(BATType *)local_2c8._8_8_ = local_140.m_bat.m_bat_type;
        local_2c8._8_8_ = (int *)(local_2c8._8_8_ + 4);
      }
      if ((Box *)local_338._8_8_ == local_328) {
        std::vector<amrex::Box,std::allocator<amrex::Box>>::_M_realloc_insert<amrex::Box_const&>
                  ((vector<amrex::Box,std::allocator<amrex::Box>> *)local_338,
                   (iterator)local_338._8_8_,&__args->second);
      }
      else {
        uVar15 = *(undefined8 *)(__args->second).smallend.vect;
        uVar16 = *(undefined8 *)((__args->second).smallend.vect + 2);
        *(undefined1 (*) [16])(local_338._8_8_ + 0xc) =
             *(undefined1 (*) [16])&(__args->second).bigend;
        *(undefined8 *)((IntVect *)local_338._8_8_)->vect = uVar15;
        *(undefined8 *)(((IntVect *)local_338._8_8_)->vect + 2) = uVar16;
        local_338._8_8_ = (Box *)(local_338._8_8_ + 0x1c);
      }
      if (iStack_2e0._M_current == local_2d8) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)&local_2e8,iStack_2e0,&__args->first);
      }
      else {
        *iStack_2e0._M_current = __args->first;
        iStack_2e0._M_current = iStack_2e0._M_current + 1;
      }
      __args = __args + 1;
    } while (__args != (pointer)uVar14);
  }
  BoxArray::BoxArray(&local_140,(Box *)local_338._0_8_,
                     (int)((ulong)(local_338._8_8_ - local_338._0_8_) >> 2) * -0x49249249);
  DistributionMapping::DistributionMapping
            (&local_1e8,(Vector<int,_std::allocator<int>_> *)local_2c8);
  pFVar22 = (FabArrayBase *)operator_new(0x180);
  local_58._1_7_ = 0;
  local_58.alloc = true;
  local_58.arena = (Arena *)0x0;
  local_58.tags.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.tags.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.tags.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  MultiFab::MultiFab((MultiFab *)pFVar22,&local_140,&local_1e8,ncomp,0,&local_58,
                     (((__uniq_ptr_data<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>,_true,_true>
                        *)&local_318[1]._vptr_FabArrayBase)->
                     super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                     )._M_t.
                     super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                     .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>.
                     _M_head_impl);
  *(FabArrayBase **)local_320.super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl = pFVar22
  ;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_58.tags.
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           );
  if (local_1e8.m_ref.
      super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1e8.m_ref.
               super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  BoxArray::~BoxArray(&local_140);
  if ((pointer)local_2c8._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_2c8._0_8_,(long)local_2b8 - local_2c8._0_8_);
  }
  if ((void *)local_338._0_8_ != (void *)0x0) {
    operator_delete((void *)local_338._0_8_,(long)local_328 - local_338._0_8_);
  }
  if ((pointer)local_268._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_268._0_8_,(long)local_258 - local_268._0_8_);
  }
  BoxArray::~BoxArray(&local_1a8);
  MFIter::MFIter((MFIter *)&local_1a8,pFVar22,true);
  if (local_1a8.m_bat.m_op.m_bndryReg.m_loshft.vect[2] <
      local_1a8.m_bat.m_op.m_bndryReg.m_hishft.vect[1]) {
    local_210 = (long)start_comp;
    local_1f8 = (ulong)(uint)ncomp;
    local_280 = (ulong)(uint)dir;
    local_218 = pFVar22;
    do {
      pFVar22 = local_318;
      piVar24 = local_1a8.m_bat.m_op.m_bndryReg.m_loshft.vect + 2;
      if ((long *)local_1a8.m_bat.m_op._60_8_ != (long *)0x0) {
        piVar24 = (int *)((long)local_1a8.m_bat.m_op.m_bndryReg.m_loshft.vect[2] * 4 +
                         *(long *)local_1a8.m_bat.m_op._60_8_);
      }
      this_00 = *(BaseFab<double> **)
                 (*(long *)((long)&local_218[1].boxarray.m_bat.m_op + 0xc) + (long)*piVar24 * 8);
      iVar21 = FabArrayBase::localindex
                         (local_318,
                          *(int *)((long)local_2e8 +
                                  (long)*(int *)(*(long *)local_1a8.m_bat.m_op._52_8_ +
                                                (long)local_1a8.m_bat.m_op.m_bndryReg.m_loshft.vect
                                                      [2] * 4) * 4));
      src = *(BaseFab<double> **)
             (*(long *)((long)&pFVar22[1].boxarray.m_bat.m_op + 0xc) + (long)iVar21 * 8);
      local_308 = this_00->dptr;
      iVar21 = (this_00->domain).smallend.vect[0];
      iVar3 = (this_00->domain).smallend.vect[1];
      iVar4 = (this_00->domain).smallend.vect[2];
      iVar5 = (this_00->domain).bigend.vect[0];
      iVar6 = (this_00->domain).bigend.vect[1];
      local_2f8 = (double *)CONCAT44(local_2f8._4_4_,(this_00->domain).bigend.vect[2]);
      local_200 = src->dptr;
      iVar7 = (src->domain).smallend.vect[0];
      iVar8 = (src->domain).smallend.vect[1];
      iVar9 = (src->domain).smallend.vect[2];
      iVar10 = (src->domain).bigend.vect[0];
      local_300 = CONCAT44(local_300._4_4_,(src->domain).bigend.vect[1]);
      local_2f0 = CONCAT44(local_2f0._4_4_,(src->domain).bigend.vect[2]);
      MFIter::tilebox((Box *)&local_140,(MFIter *)&local_1a8);
      uVar20 = local_140.m_bat.m_op.m_bndryReg.m_crse_ratio.vect[0];
      BVar19 = local_140.m_bat.m_bat_type;
      if (interpolate) {
        lVar23 = (long)(int)local_140.m_bat.m_bat_type;
        local_298._0_8_ = (long)(int)local_140.m_bat.m_op.m_indexType.m_typ.itype;
        local_310 = (long)(int)local_140.m_bat.m_op.m_bndryReg.m_typ.itype;
        local_270 = (ulong)(uint)local_140.m_bat.m_op.m_bndryReg.m_crse_ratio.vect[1];
        local_278 = (ulong)(uint)local_140.m_bat.m_op.m_bndryReg.m_crse_ratio.vect[2];
        dVar34 = (local_220 - local_d8[local_228]) / local_88[local_228];
        dVar35 = floor(dVar34 + 0.5);
        dVar34 = dVar34 - ((double)((int)dVar35 + -1) + 0.5);
        if (0.5 <= dVar34) {
          if (2 < (uint)dir) goto LAB_005959e1;
          local_398 = (int)*(undefined8 *)(&DAT_0079f2c8 + local_280 * 8);
          local_2a8 = *(double *)(&DAT_0079f2e0 + local_280 * 8);
          iVar28 = (int)*(undefined8 *)(&DAT_0079f2f8 + local_280 * 8);
          local_3a8 = 0;
          local_390 = 0;
          iVar25 = 0;
        }
        else {
          if ((uint)dir < 3) {
            local_3a8 = (int)*(undefined8 *)(&DAT_0079f280 + local_280 * 8);
            local_390 = (int)*(undefined8 *)(&DAT_0079f298 + local_280 * 8);
            iVar25 = (int)*(undefined8 *)(&DAT_0079f2b0 + local_280 * 8);
          }
          else {
LAB_005959e1:
            local_3a8 = 0;
            local_390 = 0;
            iVar25 = 0;
          }
          local_398 = 0;
          local_2a8 = 0.0;
          iVar28 = 0;
        }
        if (0 < ncomp) {
          lVar29 = (long)((iVar6 - iVar3) + 1);
          uVar14 = local_298._0_8_;
          lVar30 = (long)((iVar5 - iVar21) + 1);
          lVar31 = (long)((iVar10 - iVar7) + 1);
          local_300 = (((int)local_300 - iVar8) + 1) * lVar31;
          local_208 = (((int)local_2f0 - iVar9) + 1) * local_300;
          local_308 = (double *)
                      ((long)local_308 +
                      (local_298._0_8_ * 8 + (local_310 - iVar4) * lVar29 * 8 + (long)iVar3 * -8) *
                      lVar30 + lVar23 * 8 + (long)iVar21 * -8);
          lVar29 = lVar29 * lVar30;
          local_2f0 = lVar29 * 8;
          local_1f0 = (((int)local_2f8 - iVar4) + 1) * local_2f0;
          local_3b8 = 0;
          do {
            if ((int)local_310 <= (int)local_278) {
              local_2f8 = local_200 + (local_210 + local_3b8) * local_208;
              local_358 = local_308;
              local_368 = local_310;
              do {
                if ((int)local_298._0_4_ <= (int)local_270) {
                  pdVar27 = local_358;
                  lVar23 = uVar14;
                  do {
                    if ((int)BVar19 <= (int)uVar20) {
                      lVar26 = 0;
                      do {
                        pdVar27[lVar26] =
                             local_2f8[(((int)local_368 + local_398) - iVar9) * local_300 +
                                       (((int)lVar23 + SUB84(local_2a8,0)) - iVar8) * lVar31 +
                                       (long)(int)(((iVar28 + BVar19) - iVar7) + (int)lVar26)] *
                             (1.0 - dVar34) +
                             local_2f8[(((int)local_368 + local_390) - iVar9) * local_300 +
                                       (((int)lVar23 + local_3a8) - iVar8) * lVar31 +
                                       (long)(int)(((iVar25 + BVar19) - iVar7) + (int)lVar26)] *
                             dVar34;
                        lVar26 = lVar26 + 1;
                      } while ((uVar20 - BVar19) + 1 != (int)lVar26);
                    }
                    lVar23 = lVar23 + 1;
                    pdVar27 = pdVar27 + lVar30;
                  } while ((int)local_270 + 1 != (int)lVar23);
                }
                local_368 = local_368 + 1;
                local_358 = local_358 + lVar29;
              } while ((int)local_278 + 1 != (int)local_368);
            }
            local_3b8 = local_3b8 + 1;
            local_308 = (double *)((long)local_308 + local_1f0);
          } while (local_3b8 != local_1f8);
        }
      }
      else {
        BaseFab<double>::copy<(amrex::RunOn)0>
                  (this_00,src,(Box *)&local_140,start_comp,(Box *)&local_140,0,ncomp);
      }
      MFIter::operator++((MFIter *)&local_1a8);
    } while (local_1a8.m_bat.m_op.m_bndryReg.m_loshft.vect[2] <
             local_1a8.m_bat.m_op.m_bndryReg.m_hishft.vect[1]);
  }
  MFIter::~MFIter((MFIter *)&local_1a8);
  if (local_2e8 != (void *)0x0) {
    operator_delete(local_2e8,(long)local_2d8 - (long)local_2e8);
  }
  return (unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>)
         (MultiFab *)local_320.super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<MultiFab> get_slice_data(int dir, Real coord, const MultiFab& cc, const Geometry& geom, int start_comp, int ncomp, bool interpolate) {

        BL_PROFILE("amrex::get_slice_data");

        if (interpolate) {
            AMREX_ASSERT(cc.nGrow() >= 1);
        }

        const auto geomdata = geom.data();

        Vector<int> slice_to_full_ba_map;
        std::unique_ptr<MultiFab> slice = allocateSlice(dir, cc, ncomp, geom, coord, slice_to_full_ba_map);

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
        for (MFIter mfi(*slice, TilingIfNotGPU()); mfi.isValid(); ++mfi)
        {
            int slice_gid = mfi.index();
            int full_gid = slice_to_full_ba_map[slice_gid];
            auto& slice_fab = (*slice)[mfi];
            auto const& full_fab = cc[full_gid];
            Array4<Real> const& slice_arr = slice_fab.array();
            Array4<Real const> const& full_arr = full_fab.const_array();

            const Box& tile_box  = mfi.tilebox();

            if (interpolate)
            {
                AMREX_LAUNCH_HOST_DEVICE_LAMBDA( tile_box, thread_box,
                {
                    amrex_fill_slice_interp(thread_box, slice_arr, full_arr,
                                            0, start_comp, ncomp,
                                            dir, coord, geomdata);
                });
            }
            else
            {
                slice_fab.copy<RunOn::Device>(full_fab, tile_box, start_comp, tile_box, 0, ncomp);
            }
        }

        return slice;
    }